

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Callback.cpp
# Opt level: O2

void __thiscall Callback::Emitter::~Emitter(Emitter *this)

{
  SignalActivation *pSVar1;
  Item *pIVar2;
  bool bVar3;
  Item *in_RAX;
  Iterator IVar4;
  MemberFuncPtr *signal;
  Item *other;
  Slot *slotData;
  Item *pIVar5;
  Item *local_38;
  
  other = (this->signalData)._begin.item;
  local_38 = in_RAX;
  do {
    if (other == (this->signalData)._end.item) {
      Map<Callback::MemberFuncPtr,_Callback::Emitter::SignalData>::~Map(&this->signalData);
      return;
    }
    pSVar1 = (other->value).activation;
    if (pSVar1 != (SignalActivation *)0x0) {
      pSVar1->invalidated = true;
    }
    pIVar2 = (other->value).slots._end.item;
    for (pIVar5 = (other->value).slots._begin.item; pIVar5 != pIVar2; pIVar5 = pIVar5->next) {
      if ((pIVar5->value).state != disconnected) {
        local_38 = (Item *)this;
        IVar4 = Map<Callback::Emitter_*,_List<Callback::Listener::Signal>_>::find
                          (&((pIVar5->value).receiver)->slotData,(Emitter **)&local_38);
        if (IVar4.item != (((pIVar5->value).receiver)->slotData)._end.item) {
          for (local_38 = ((IVar4.item)->value)._begin.item;
              ((IVar4.item)->value)._end.item != local_38; local_38 = local_38->next) {
            bVar3 = MemberFuncPtr::operator==((MemberFuncPtr *)local_38,&other->key);
            if (bVar3) {
              bVar3 = MemberFuncPtr::operator==(&(local_38->value).slot,&(pIVar5->value).slot);
              if (bVar3) {
                List<Callback::Listener::Signal>::remove(&(IVar4.item)->value,(char *)&local_38);
                break;
              }
            }
          }
        }
      }
    }
    other = other->next;
  } while( true );
}

Assistant:

Callback::Emitter::~Emitter()
{
  for(Map<MemberFuncPtr, SignalData>::Iterator i = signalData.begin(); i != signalData.end(); ++i)
  {
    const MemberFuncPtr& signal = i.key();
    SignalData& data = *i;
    if(data.activation)
      data.activation->invalidated = true;
    for(List<Slot>::Iterator i = data.slots.begin(), end = data.slots.end(); i != end; ++i)
    {
      Slot& slotData = *i;
      if(slotData.state == Slot::disconnected)
        continue;
      Map<Callback::Emitter*, List<Callback::Listener::Signal> >::Iterator it = slotData.receiver->slotData.find(this);
      if(it != slotData.receiver->slotData.end())
      {
        List<Callback::Listener::Signal>& signals = *it;
        for(List<Callback::Listener::Signal>::Iterator i = signals.begin(); i != signals.end(); ++i)
          if(i->signal == signal && i->slot == slotData.slot)
          {
            signals.remove(i);
            break;
          }
      }
    }
  }
}